

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O2

void Msat_SolverRemoveMarked(Msat_Solver_t *p)

{
  int iVar1;
  uint uVar2;
  Msat_Clause_t **ppMVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  ppMVar3 = Msat_ClauseVecReadArray(p->vClauses);
  for (lVar6 = (long)p->nClausesStart; lVar6 < iVar1; lVar6 = lVar6 + 1) {
    Msat_ClauseFree(p,ppMVar3[lVar6],1);
  }
  Msat_ClauseVecShrink(p->vClauses,p->nClausesStart);
  uVar2 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar3 = Msat_ClauseVecReadArray(p->vLearned);
  uVar4 = 0;
  uVar5 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    Msat_ClauseFree(p,ppMVar3[uVar4],1);
  }
  Msat_ClauseVecShrink(p->vLearned,0);
  iVar1 = Msat_ClauseVecReadSize(p->vClauses);
  p->nClauses = iVar1;
  return;
}

Assistant:

void Msat_SolverRemoveMarked( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned, ** pClauses;
    int nLearned, nClauses, i;

    // discard the learned clauses
    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = p->nClausesStart; i < nClauses; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pClauses[i]) );
        Msat_ClauseFree( p, pClauses[i], 1 );
    }
    Msat_ClauseVecShrink( p->vClauses, p->nClausesStart );

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
//        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);
/*
    // undo the previous data
    for ( i = 0; i < p->nVarsAlloc; i++ )
    {
        p->pAssigns[i]   = MSAT_VAR_UNASSIGNED;
        p->pReasons[i]   = NULL;
        p->pLevel[i]     = -1;
        p->pdActivity[i] = 0.0;
    }
    Msat_OrderClean( p->pOrder, p->nVars, NULL );
    Msat_QueueClear( p->pQueue );
*/
}